

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFileParser.cpp
# Opt level: O2

void __thiscall LabelFileParser::readLabelFile(LabelFileParser *this)

{
  istream *piVar1;
  int iVar2;
  int local_1f4;
  string token;
  string str;
  istringstream stream;
  
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"Can\'t open labelfile");
LAB_001157c9:
    exit(1);
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  local_1f4 = 0;
  do {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)&str);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&str);
      return;
    }
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)&str,_S_in);
    if (local_1f4 != 0) {
      iVar2 = 0;
      while( true ) {
        piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream,(string *)&token,',');
        if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
        if (iVar2 != 0) {
          if (iVar2 != 1) {
            std::operator<<((ostream *)&std::cout,"Label file must be one dimension.");
            goto LAB_001157c9;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->_label,&token);
        }
        iVar2 = iVar2 + 1;
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
    std::__cxx11::string::~string((string *)&token);
    local_1f4 = local_1f4 + 1;
  } while( true );
}

Assistant:

void LabelFileParser::readLabelFile(){//{{{
    if(!_inputText){
        cout<<"Can't open labelfile";
        exit(1);
    }
    string str;
    for(int i=0;getline(_inputText,str);i++){
        string token;
        istringstream stream(str);
        if(i == 0) continue;
        for(int j=0; getline(stream,token,','); j++){
            if(j == 0)continue;
            if(j > 1){
                cout<<"Label file must be one dimension.";
                exit(1);
            }
            _label.push_back(token);
        }
    }
}